

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_getForce.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::getForce
          (NavierStokesBase *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,
          FArrayBox *State,FArrayBox *Aux,int auxScomp,MFIter *param_9)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  int j;
  ostream *poVar6;
  Print *pPVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  NumComps ncomp_00;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  DestComp local_218;
  Print local_1d0;
  Real local_48;
  undefined8 uStack_40;
  
  local_218.i = 0;
  amrex::BaseFab<double>::dataPtr(&State->super_BaseFab<double>,0);
  amrex::BaseFab<double>::dataPtr(&Aux->super_BaseFab<double>,auxScomp);
  local_48 = gravity;
  uStack_40 = 0;
  if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) && (getForceVerbose != 0)) {
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    poVar1 = &local_1d0.ss;
    std::operator<<((ostream *)poVar1,"NavierStokesBase::getForce(): Entered...");
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"time      = ");
    std::ostream::_M_insert<double>(time);
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"scomp     = ");
    std::ostream::operator<<(poVar1,scomp);
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"ncomp     = ");
    std::ostream::operator<<(poVar1,ncomp);
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"auxScomp = ");
    std::ostream::operator<<(poVar1,auxScomp);
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    amrex::Print::~Print(&local_1d0);
    if (ncomp == 1) {
      poVar6 = amrex::OutStream();
      amrex::Print::Print(&local_1d0,poVar6);
      poVar1 = &local_1d0.ss;
      std::operator<<((ostream *)poVar1,"Doing only component ");
      std::ostream::operator<<(poVar1,scomp);
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
LAB_0022fb44:
      amrex::Print::~Print(&local_1d0);
    }
    else {
      if (ncomp == 3 && scomp == 0) {
        poVar6 = amrex::OutStream();
        amrex::Print::Print(&local_1d0,poVar6);
        std::operator<<((ostream *)&local_1d0.ss,"Doing velocities only");
        std::endl<char,std::char_traits<char>>((ostream *)&local_1d0.ss);
        goto LAB_0022fb44;
      }
      if (2 < scomp) {
        poVar6 = amrex::OutStream();
        amrex::Print::Print(&local_1d0,poVar6);
        poVar1 = &local_1d0.ss;
        std::operator<<((ostream *)poVar1,"Doing ");
        std::ostream::operator<<(poVar1,ncomp);
        std::operator<<((ostream *)poVar1," component(s) starting with component ");
        std::ostream::operator<<(poVar1,scomp);
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        goto LAB_0022fb44;
      }
    }
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    poVar1 = &local_1d0.ss;
    std::operator<<((ostream *)poVar1,"NavierStokesBase::getForce(): Filling Force on box:");
    amrex::operator<<((ostream *)poVar1,bx);
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    amrex::Print::~Print(&local_1d0);
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    std::operator<<((ostream *)&local_1d0.ss,"NavierStokesBase::getForce(): Force Domain:");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1d0.ss);
    amrex::Print::~Print(&local_1d0);
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    std::operator<<((ostream *)&local_1d0.ss,"(");
    pPVar7 = amrex::Print::operator<<(&local_1d0,(int *)&(force->super_BaseFab<double>).domain);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<
                       (pPVar7,(force->super_BaseFab<double>).domain.smallend.vect + 1);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<
                       (pPVar7,(force->super_BaseFab<double>).domain.smallend.vect + 2);
    std::operator<<((ostream *)&pPVar7->ss,") - ");
    std::operator<<((ostream *)&pPVar7->ss,"(");
    pPVar7 = amrex::Print::operator<<(pPVar7,(force->super_BaseFab<double>).domain.bigend.vect);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(force->super_BaseFab<double>).domain.bigend.vect + 1);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(force->super_BaseFab<double>).domain.bigend.vect + 2);
    std::operator<<((ostream *)&pPVar7->ss,")");
    std::endl<char,std::char_traits<char>>((ostream *)&pPVar7->ss);
    amrex::Print::~Print(&local_1d0);
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    std::operator<<((ostream *)&local_1d0.ss,"NavierStokesBase::getForce(): Vel Domain:");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1d0.ss);
    amrex::Print::~Print(&local_1d0);
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    std::operator<<((ostream *)&local_1d0.ss,"(");
    pPVar7 = amrex::Print::operator<<(&local_1d0,(int *)&(State->super_BaseFab<double>).domain);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<
                       (pPVar7,(State->super_BaseFab<double>).domain.smallend.vect + 1);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<
                       (pPVar7,(State->super_BaseFab<double>).domain.smallend.vect + 2);
    std::operator<<((ostream *)&pPVar7->ss,") - ");
    std::operator<<((ostream *)&pPVar7->ss,"(");
    pPVar7 = amrex::Print::operator<<(pPVar7,(State->super_BaseFab<double>).domain.bigend.vect);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(State->super_BaseFab<double>).domain.bigend.vect + 1);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(State->super_BaseFab<double>).domain.bigend.vect + 2);
    std::operator<<((ostream *)&pPVar7->ss,")");
    std::endl<char,std::char_traits<char>>((ostream *)&pPVar7->ss);
    amrex::Print::~Print(&local_1d0);
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    std::operator<<((ostream *)&local_1d0.ss,"NavierStokesBase::getForce(): Scal Domain:");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1d0.ss);
    amrex::Print::~Print(&local_1d0);
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    std::operator<<((ostream *)&local_1d0.ss,"(");
    pPVar7 = amrex::Print::operator<<(&local_1d0,(int *)&(Aux->super_BaseFab<double>).domain);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(Aux->super_BaseFab<double>).domain.smallend.vect + 1);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(Aux->super_BaseFab<double>).domain.smallend.vect + 2);
    std::operator<<((ostream *)&pPVar7->ss,") - ");
    std::operator<<((ostream *)&pPVar7->ss,"(");
    pPVar7 = amrex::Print::operator<<(pPVar7,(Aux->super_BaseFab<double>).domain.bigend.vect);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(Aux->super_BaseFab<double>).domain.bigend.vect + 1);
    std::operator<<((ostream *)&pPVar7->ss,",");
    pPVar7 = amrex::Print::operator<<(pPVar7,(Aux->super_BaseFab<double>).domain.bigend.vect + 2);
    std::operator<<((ostream *)&pPVar7->ss,")");
    std::endl<char,std::char_traits<char>>((ostream *)&pPVar7->ss);
    amrex::Print::~Print(&local_1d0);
    poVar1 = &local_1d0.ss;
    iVar14 = 0;
    iVar13 = scomp;
    if (0 < ncomp) {
      iVar14 = ncomp;
    }
    while (iVar14 != 0) {
      poVar6 = amrex::OutStream();
      amrex::Print::Print(&local_1d0,poVar6);
      std::operator<<((ostream *)poVar1,"State comp ");
      std::ostream::operator<<(poVar1,iVar13);
      std::operator<<((ostream *)poVar1," min/max ");
      dVar27 = amrex::BaseFab<double>::min<(amrex::RunOn)0>(&State->super_BaseFab<double>,iVar13);
      std::ostream::_M_insert<double>(dVar27);
      std::operator<<((ostream *)poVar1," / ");
      dVar27 = amrex::BaseFab<double>::max<(amrex::RunOn)0>(&State->super_BaseFab<double>,iVar13);
      std::ostream::_M_insert<double>(dVar27);
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      amrex::Print::~Print(&local_1d0);
      iVar14 = iVar14 + -1;
      iVar13 = iVar13 + 1;
    }
    poVar1 = &local_1d0.ss;
    for (iVar14 = auxScomp; iVar14 < (Aux->super_BaseFab<double>).nvar; iVar14 = iVar14 + 1) {
      poVar6 = amrex::OutStream();
      amrex::Print::Print(&local_1d0,poVar6);
      std::operator<<((ostream *)poVar1,"aux comp ");
      std::ostream::operator<<(poVar1,iVar14);
      std::operator<<((ostream *)poVar1," min/max ");
      dVar27 = amrex::BaseFab<double>::min<(amrex::RunOn)0>(&Aux->super_BaseFab<double>,iVar14);
      std::ostream::_M_insert<double>(dVar27);
      std::operator<<((ostream *)poVar1," / ");
      dVar27 = amrex::BaseFab<double>::max<(amrex::RunOn)0>(&Aux->super_BaseFab<double>,iVar14);
      std::ostream::_M_insert<double>(dVar27);
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      amrex::Print::~Print(&local_1d0);
    }
  }
  ncomp_00.n = ncomp;
  if (scomp < 3) {
    if (scomp != 0) {
      amrex::Assert_host("scomp==Xvel",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
                         ,0x7c,(char *)0x0);
    }
    if (ncomp < 3) {
      amrex::Assert_host("ncomp>=AMREX_SPACEDIM",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
                         ,0x7d,(char *)0x0);
    }
    if (scomp == 0) {
      if (ABS(local_48) <= 0.0001) {
        local_1d0.rank = 0;
        local_1d0.comm = 0;
        amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                  (&force->super_BaseFab<double>,(double *)&local_1d0,bx,(DestComp)0x0,(NumComps)0x3
                  );
      }
      else {
        pdVar5 = (force->super_BaseFab<double>).dptr;
        iVar14 = (force->super_BaseFab<double>).domain.smallend.vect[0];
        lVar15 = (long)iVar14;
        iVar13 = (force->super_BaseFab<double>).domain.smallend.vect[1];
        lVar23 = (long)iVar13;
        iVar2 = (force->super_BaseFab<double>).domain.smallend.vect[2];
        lVar22 = (long)iVar2;
        lVar8 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[0] - iVar14) + 1);
        lVar9 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[1] - iVar13) + 1);
        iVar14 = (Aux->super_BaseFab<double>).domain.smallend.vect[0];
        iVar13 = (Aux->super_BaseFab<double>).domain.smallend.vect[1];
        iVar3 = (Aux->super_BaseFab<double>).domain.smallend.vect[2];
        lVar17 = (long)(bx->smallend).vect[2];
        lVar11 = (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[0] - iVar14) + 1);
        lVar20 = (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[1] - iVar13) + 1);
        lVar18 = (long)(bx->smallend).vect[1];
        iVar4 = (bx->smallend).vect[0];
        lVar16 = (long)iVar4;
        lVar19 = ((lVar17 * 8 +
                   (long)auxScomp *
                   (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1) * 8 +
                  (long)iVar3 * -8) * lVar20 + lVar18 * 8 + (long)iVar13 * -8) * lVar11 + lVar16 * 8
                 + (long)iVar14 * -8 + (long)(Aux->super_BaseFab<double>).dptr;
        lVar10 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
        iVar14 = (bx->bigend).vect[0];
        iVar13 = (bx->bigend).vect[1];
        iVar2 = (bx->bigend).vect[2];
        lVar24 = ((lVar10 * 0x10 + lVar17 * 8 + lVar22 * -8) * lVar9 + lVar18 * 8 + lVar23 * -8) *
                 lVar8 + lVar16 * 8 + lVar15 * -8 + (long)pdVar5;
        lVar12 = ((lVar10 * 8 + lVar17 * 8 + lVar22 * -8) * lVar9 + lVar18 * 8 + lVar23 * -8) *
                 lVar8 + lVar16 * 8 + lVar15 * -8 + (long)pdVar5;
        lVar10 = (lVar18 * 8 + (lVar17 - lVar22) * lVar9 * 8 + lVar23 * -8) * lVar8 + lVar16 * 8 +
                 lVar15 * -8 + (long)pdVar5;
        lVar9 = lVar9 * lVar8 * 8;
        lVar8 = lVar8 * 8;
        for (; lVar15 = lVar18, lVar16 = lVar19, lVar22 = lVar12, lVar23 = lVar10, lVar25 = lVar24,
            lVar17 <= iVar2; lVar17 = lVar17 + 1) {
          for (; lVar15 <= iVar13; lVar15 = lVar15 + 1) {
            if (iVar4 <= iVar14) {
              lVar21 = 0;
              do {
                *(undefined8 *)(lVar23 + lVar21 * 8) = 0;
                *(undefined8 *)(lVar22 + lVar21 * 8) = 0;
                *(double *)(lVar25 + lVar21 * 8) = *(double *)(lVar16 + lVar21 * 8) * local_48;
                lVar21 = lVar21 + 1;
              } while ((iVar14 - iVar4) + 1 != (int)lVar21);
            }
            lVar16 = lVar16 + lVar11 * 8;
            lVar22 = lVar22 + lVar8;
            lVar23 = lVar23 + lVar8;
            lVar25 = lVar25 + lVar8;
          }
          lVar19 = lVar19 + lVar20 * lVar11 * 8;
          lVar24 = lVar24 + lVar9;
          lVar12 = lVar12 + lVar9;
          lVar10 = lVar10 + lVar9;
        }
      }
    }
    if (scomp + ncomp < 4) goto LAB_0023043a;
    ncomp_00.n = ncomp + -3;
    local_218.i = 3;
  }
  if (0 < ncomp_00.n) {
    local_1d0.rank = 0;
    local_1d0.comm = 0;
    amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
              (&force->super_BaseFab<double>,(double *)&local_1d0,bx,local_218,ncomp_00);
  }
LAB_0023043a:
  if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) && (getForceVerbose != 0)) {
    poVar1 = &local_1d0.ss;
    iVar14 = 0;
    if (0 < ncomp) {
      iVar14 = ncomp;
    }
    while (bVar26 = iVar14 != 0, iVar14 = iVar14 + -1, bVar26) {
      poVar6 = amrex::OutStream();
      amrex::Print::Print(&local_1d0,poVar6);
      std::operator<<((ostream *)poVar1,"Force comp ");
      std::ostream::operator<<(poVar1,scomp);
      std::operator<<((ostream *)poVar1," min/max ");
      dVar27 = amrex::BaseFab<double>::min<(amrex::RunOn)0>(&force->super_BaseFab<double>,scomp);
      std::ostream::_M_insert<double>(dVar27);
      std::operator<<((ostream *)poVar1," / ");
      dVar27 = amrex::BaseFab<double>::max<(amrex::RunOn)0>(&force->super_BaseFab<double>,scomp);
      std::ostream::_M_insert<double>(dVar27);
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      amrex::Print::~Print(&local_1d0);
      scomp = scomp + 1;
    }
    poVar6 = amrex::OutStream();
    amrex::Print::Print(&local_1d0,poVar6);
    poVar1 = &local_1d0.ss;
    std::operator<<((ostream *)poVar1,"NavierStokesBase::getForce(): Leaving...");
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"---");
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    amrex::Print::~Print(&local_1d0);
  }
  return;
}

Assistant:

void
NavierStokesBase::getForce (FArrayBox&       force,
                            const Box&       bx,
                            int              scomp,
                            int              ncomp,
                            const Real       time,
                            const FArrayBox& State,
                            const FArrayBox& Aux,
                            int              auxScomp,
                            const MFIter&    /*mfi*/)
{

   const Real* StateDataPtr  = State.dataPtr();
   const Real* auxDataPtr = Aux.dataPtr(auxScomp);

   const Real  grav     = gravity;

   if (ParallelDescriptor::IOProcessor() && getForceVerbose)
   {
       const int*  f_lo     = force.loVect();
       const int*  f_hi     = force.hiVect();
       const int*  v_lo     = State.loVect();
       const int*  v_hi     = State.hiVect();
       const int*  s_lo     = Aux.loVect();
       const int*  s_hi     = Aux.hiVect();
       
       amrex::Print() << "NavierStokesBase::getForce(): Entered..." << std::endl 
		      << "time      = " << time << std::endl
		      << "scomp     = " << scomp << std::endl
		      << "ncomp     = " << ncomp << std::endl
		      << "auxScomp = " << auxScomp << std::endl;
       
       if  (ncomp==1) amrex::Print() << "Doing only component " << scomp << std::endl;
       else if (scomp==0 && ncomp==AMREX_SPACEDIM) amrex::Print() << "Doing velocities only" << std::endl;
       else if (scomp>=AMREX_SPACEDIM) amrex::Print() << "Doing " << ncomp << " component(s) starting with component " << scomp << std::endl;

       amrex::Print() << "NavierStokesBase::getForce(): Filling Force on box:"
		      << bx << std::endl;
#if (AMREX_SPACEDIM == 3)
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << "," << f_lo[2] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << "," << f_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Vel Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << "," << v_lo[2] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << "," << v_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Scal Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << "," << s_lo[2] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << "," << s_hi[2] << ")" << std::endl;
#else
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): State Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Aux Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << ")" << std::endl;
#endif

       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "State comp " << scomp+n << " min/max " 
			  << State.min<RunOn::Gpu>(scomp+n) << " / "
			  << State.max<RunOn::Gpu>(scomp+n) << std::endl;
       }
       for (int n=auxScomp; n<Aux.nComp(); n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "aux comp " << n << " min/max " 
			  << Aux.min<RunOn::Gpu>(n) << " / "
			  << Aux.max<RunOn::Gpu>(n) << std::endl;
       }
   } //end if(getForceVerbose)

   //
   // Here's the meat
   //
   // Velocity forcing
   //
   if ( scomp<AMREX_SPACEDIM ){
       AMREX_ALWAYS_ASSERT(scomp==Xvel);
       AMREX_ALWAYS_ASSERT(ncomp>=AMREX_SPACEDIM);
   }

   if ( scomp==Xvel ){
     //
     // TODO: add some switch for user-supplied/problem-dependent forcing
     //
     auto const& frc = force.array(scomp);
     auto const& aux = Aux.array(auxScomp);

     if ( std::abs(grav) > 0.0001) {
       amrex::ParallelFor(bx, [frc, aux, grav]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
	 frc(i,j,k,0) = Real(0.0);
#if ( AMREX_SPACEDIM == 2 )
         frc(i,j,k,1) = grav*aux(i,j,k,0);
#elif ( AMREX_SPACEDIM == 3 )
         frc(i,j,k,1) = Real(0.0);
         frc(i,j,k,2) = grav*aux(i,j,k,0);
#endif
       });
     }
     else {
       force.setVal<RunOn::Gpu>(0.0, bx, Xvel, AMREX_SPACEDIM);
     }
   }

   //
   // Scalar forcing
   //
   // During a regular timestep, getForce is called on scalars only.
   // During the multilevel sync, scalars are done with velocity.
   //
   int scomp_scal = -1;
   int ncomp_scal = -1;
   if ( scomp >= AMREX_SPACEDIM ) {
       // Doing only scalars
       scomp_scal = 0;
       ncomp_scal = ncomp;
   }
   // Recall that we will only get here if previous block is false,
   // i.e. if scomp < AMREX_SPACEDIM
   else if ( scomp+ncomp > AMREX_SPACEDIM) {
       // Doing scalars with vel
       scomp_scal = Density;
       ncomp_scal = ncomp-Density;
   }

   if (ncomp_scal > 0) {
       force.setVal<RunOn::Gpu>(0.0, bx, scomp_scal, ncomp_scal);
       //
       // Or create user-defined forcing.
       // Recall we compute a density-weighted forcing term.
       //
       // auto const& frc  = force.array(scomp_scal);
       // amrex::ParallelFor(bx, ncomp_scal, [frc]
       // AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       // {
       //          frc(i,j,k,n) = ;
       //          frc(i,j,k,n) *= rho;
       // });
   }
     
   if (ParallelDescriptor::IOProcessor() && getForceVerbose) {
       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "Force comp " << scomp+n << " min/max " 
			  << force.min<RunOn::Gpu>(scomp+n) << " / "
			  << force.max<RunOn::Gpu>(scomp+n) << std::endl;
       }

      amrex::Print() << "NavierStokesBase::getForce(): Leaving..." 
                     << std::endl << "---" << std::endl;
   }
}